

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::facenormal(tetgenmesh *this,point pa,point pb,point pc,double *n,int pivot,double *lav)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double L3;
  double L2;
  double L1;
  double *pv2;
  double *pv1;
  double v3 [3];
  double local_78;
  double v2 [3];
  double local_58;
  double v1 [3];
  int pivot_local;
  double *n_local;
  point pc_local;
  point pb_local;
  point pa_local;
  tetgenmesh *this_local;
  
  local_58 = *pb - *pa;
  v1[0] = pb[1] - pa[1];
  v1[1] = pb[2] - pa[2];
  local_78 = *pa - *pc;
  v2[0] = pa[1] - pc[1];
  v2[1] = pa[2] - pc[2];
  if (pivot < 1) {
    pv2 = &local_58;
    L1 = (double)&local_78;
  }
  else {
    pv1 = (double *)(*pc - *pb);
    v3[0] = pc[1] - pb[1];
    v3[1] = pc[2] - pb[2];
    dVar1 = dot(this,&local_58,&local_58);
    dVar2 = dot(this,&local_78,&local_78);
    dVar3 = dot(this,(double *)&pv1,(double *)&pv1);
    if (dVar2 <= dVar1) {
      if (dVar3 <= dVar1) {
        pv2 = &local_78;
        L1 = (double)&pv1;
      }
      else {
        pv2 = &local_58;
        L1 = (double)&local_78;
      }
    }
    else if (dVar3 <= dVar2) {
      pv2 = (double *)&pv1;
      L1 = (double)&local_58;
    }
    else {
      pv2 = &local_58;
      L1 = (double)&local_78;
    }
    if (lav != (double *)0x0) {
      dVar1 = sqrt(dVar1);
      dVar2 = sqrt(dVar2);
      dVar3 = sqrt(dVar3);
      *lav = (dVar1 + dVar2 + dVar3) / 3.0;
    }
  }
  cross(this,pv2,(double *)L1,n);
  *n = -*n;
  n[1] = -n[1];
  n[2] = -n[2];
  return;
}

Assistant:

void tetgenmesh::facenormal(point pa, point pb, point pc, REAL *n, int pivot,
                            REAL* lav)
{
  REAL v1[3], v2[3], v3[3], *pv1, *pv2;
  REAL L1, L2, L3;

  v1[0] = pb[0] - pa[0];  // edge vector v1: a->b
  v1[1] = pb[1] - pa[1];
  v1[2] = pb[2] - pa[2];
  v2[0] = pa[0] - pc[0];  // edge vector v2: c->a
  v2[1] = pa[1] - pc[1];
  v2[2] = pa[2] - pc[2];

  // Default, normal is calculated by: v1 x (-v2) (see Fig. fnormal).
  if (pivot > 0) {
    // Choose edge vectors by Burdakov's algorithm.
    v3[0] = pc[0] - pb[0];  // edge vector v3: b->c
    v3[1] = pc[1] - pb[1];
    v3[2] = pc[2] - pb[2];
    L1 = dot(v1, v1);
    L2 = dot(v2, v2);
    L3 = dot(v3, v3);
    // Sort the three edge lengths.
    if (L1 < L2) {
      if (L2 < L3) {
        pv1 = v1; pv2 = v2; // n = v1 x (-v2).
      } else {
        pv1 = v3; pv2 = v1; // n = v3 x (-v1).
      }
    } else {
      if (L1 < L3) {
        pv1 = v1; pv2 = v2; // n = v1 x (-v2).
      } else {
        pv1 = v2; pv2 = v3; // n = v2 x (-v3).
      }
    }
    if (lav) {
      // return the average edge length.
      *lav = (sqrt(L1) + sqrt(L2) + sqrt(L3)) / 3.0;
    }
  } else {
    pv1 = v1; pv2 = v2; // n = v1 x (-v2).
  }

  // Calculate the face normal.
  cross(pv1, pv2, n);
  // Inverse the direction;
  n[0] = -n[0];
  n[1] = -n[1];
  n[2] = -n[2];
}